

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O1

void __thiscall leveldb::Options::Options(Options *this)

{
  long lVar1;
  Comparator *pCVar2;
  Env *pEVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = BytewiseComparator();
  this->comparator = pCVar2;
  this->create_if_missing = false;
  this->error_if_exists = false;
  this->paranoid_checks = false;
  pEVar3 = Env::Default();
  this->env = pEVar3;
  this->info_log = (Logger *)0x0;
  this->write_buffer_size = 0x400000;
  this->max_open_files = 1000;
  this->block_cache = (Cache *)0x0;
  this->block_size = 0x1000;
  this->block_restart_interval = 0x10;
  this->max_file_size = 0x200000;
  this->compression = kSnappyCompression;
  this->reuse_logs = false;
  this->filter_policy = (FilterPolicy *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Options::Options() : comparator(BytewiseComparator()), env(Env::Default()) {}